

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset_zone.cpp
# Opt level: O3

void __thiscall
sf2cute::SFPresetZone::SFPresetZone
          (SFPresetZone *this,weak_ptr<sf2cute::SFInstrument> *instrument,
          vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *generators,
          vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *modulators)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> local_58;
  vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> local_38;
  
  local_38.super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (generators->
       super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (generators->
       super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (generators->
       super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (generators->
  super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (generators->
  super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (generators->
  super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (modulators->
       super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (modulators->
       super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (modulators->
       super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (modulators->
  super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (modulators->
  super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (modulators->
  super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SFZone::SFZone(&this->super_SFZone,&local_38,&local_58);
  if (local_58.
      super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.
      super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFPresetZone_0011e830;
  p_Var1 = (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->parent_preset_ = (SFPreset *)0x0;
  return;
}

Assistant:

SFPresetZone::SFPresetZone(std::weak_ptr<SFInstrument> instrument,
    std::vector<SFGeneratorItem> generators,
    std::vector<SFModulatorItem> modulators) :
    SFZone(std::move(generators), std::move(modulators)),
    instrument_(std::move(instrument)),
    parent_preset_(nullptr) {
}